

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O0

Bdd __thiscall sylvan::Bdd::operator^(Bdd *this,Bdd *other)

{
  BDD from;
  BDDVAR in_ECX;
  BDD *in_RDX;
  Bdd *other_local;
  Bdd *this_local;
  
  from = sylvan_xor_RUN((sylvan *)other->bdd,*in_RDX,0,in_ECX);
  Bdd(this,from);
  return (Bdd)(BDD)this;
}

Assistant:

Bdd
Bdd::operator^(const Bdd& other) const
{
    return Bdd(sylvan_xor(bdd, other.bdd));
}